

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

pid_t testing::internal::ExecDeathTestFork(char **argv,int close_fd)

{
  bool bVar1;
  int iVar2;
  void *in_stack_00000018;
  void *stack_top;
  void *stack;
  size_t stack_size;
  bool use_fork;
  pid_t child_pid;
  ExecDeathTestArgs args;
  String *in_stack_ffffffffffffff60;
  size_t local_98;
  String *in_stack_ffffffffffffff70;
  char local_80 [16];
  String local_70;
  void *local_60;
  char local_48 [16];
  String *local_38;
  size_t local_30;
  byte local_25;
  int local_24;
  undefined1 local_20 [32];
  
  local_24 = -1;
  local_25 = FLAGS_gtest_death_test_use_fork & 1;
  if (local_25 == 0) {
    if ((ExecDeathTestFork(char_const**,int)::stack_grows_down == '\0') &&
       (iVar2 = __cxa_guard_acquire(&ExecDeathTestFork(char_const**,int)::stack_grows_down),
       iVar2 != 0)) {
      ExecDeathTestFork::stack_grows_down = StackGrowsDown();
      __cxa_guard_release(&ExecDeathTestFork(char_const**,int)::stack_grows_down);
    }
    iVar2 = getpagesize();
    local_30 = (size_t)iVar2;
    local_38 = (String *)mmap((void *)0x0,local_30,3,0x22,-1,0);
    do {
      bVar1 = IsTrue(local_38 != (String *)0xffffffffffffffff);
      if (!bVar1) {
        String::Format(local_48,"CHECK failed: File %s, line %d: %s",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/gtest/src/gtest-death-test.cc"
                       ,0x3c6,"stack != MAP_FAILED");
        DeathTestAbort(in_stack_ffffffffffffff70);
        String::~String(in_stack_ffffffffffffff60);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    if ((ExecDeathTestFork::stack_grows_down & 1U) == 0) {
      local_98 = 0;
    }
    else {
      local_98 = local_30;
    }
    local_60 = (void *)((long)&local_38->c_str_ + local_98);
    in_stack_ffffffffffffff70 = local_38;
    local_24 = clone(ExecDeathTestChildMain,local_60,0x11,local_20);
    do {
      iVar2 = munmap(local_38,local_30);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        in_stack_ffffffffffffff60 = &local_70;
        String::Format((char *)in_stack_ffffffffffffff60,"CHECK failed: File %s, line %d: %s",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/gtest/src/gtest-death-test.cc"
                       ,0x3cc,"munmap(stack, stack_size) != -1");
        DeathTestAbort(in_stack_ffffffffffffff70);
        String::~String(in_stack_ffffffffffffff60);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
  }
  if (((local_25 & 1) != 0) && (local_24 = fork(), local_24 == 0)) {
    ExecDeathTestChildMain(in_stack_00000018);
    _exit(0);
  }
  do {
    bVar1 = IsTrue(local_24 != -1);
    if (!bVar1) {
      String::Format(local_80,"CHECK failed: File %s, line %d: %s",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/gtest/src/gtest-death-test.cc"
                     ,0x3d7,"child_pid != -1");
      DeathTestAbort(in_stack_ffffffffffffff70);
      String::~String(in_stack_ffffffffffffff60);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  return local_24;
}

Assistant:

static pid_t ExecDeathTestFork(char* const* argv, int close_fd) {
  ExecDeathTestArgs args = { argv, close_fd };
  pid_t child_pid = -1;

#  if GTEST_HAS_CLONE
  const bool use_fork = GTEST_FLAG(death_test_use_fork);

  if (!use_fork) {
    static const bool stack_grows_down = StackGrowsDown();
    const size_t stack_size = getpagesize();
    // MMAP_ANONYMOUS is not defined on Mac, so we use MAP_ANON instead.
    void* const stack = mmap(NULL, stack_size, PROT_READ | PROT_WRITE,
                             MAP_ANON | MAP_PRIVATE, -1, 0);
    GTEST_DEATH_TEST_CHECK_(stack != MAP_FAILED);
    void* const stack_top =
        static_cast<char*>(stack) + (stack_grows_down ? stack_size : 0);

    child_pid = clone(&ExecDeathTestChildMain, stack_top, SIGCHLD, &args);

    GTEST_DEATH_TEST_CHECK_(munmap(stack, stack_size) != -1);
  }
#  else
  const bool use_fork = true;
#  endif  // GTEST_HAS_CLONE

  if (use_fork && (child_pid = fork()) == 0) {
      ExecDeathTestChildMain(&args);
      _exit(0);
  }

  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  return child_pid;
}